

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

void __thiscall CVmRun::push_stringvf(CVmRun *this,char *fmt,__va_list_tag *args)

{
  char *str;
  
  str = t3vsprintf_alloc(fmt,args);
  push_string(this,str);
  free(str);
  return;
}

Assistant:

void CVmRun::push_stringvf(VMG_ const char *fmt, va_list args)
{
    /* allocate and format the string */
    char *str = t3vsprintf_alloc(fmt, args);

    /* push it */
    push_string(vmg_ str);

    /* free the allocated string buffer */
    t3free(str);
}